

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O3

void __thiscall QtMWidgets::PageViewPrivate::movePages(PageViewPrivate *this)

{
  int iVar1;
  int iVar2;
  QPoint p;
  
  iVar1 = PageControl::currentIndex(this->control);
  if (iVar1 != 0) {
    QWidget::move((QPoint *)(this->pages).d.ptr[(long)iVar1 + -1]);
  }
  iVar2 = PageControl::count(this->control);
  if (iVar1 < iVar2 + -1) {
    QWidget::move((QPoint *)(this->pages).d.ptr[(long)iVar1 + 1]);
  }
  QWidget::move((QPoint *)(this->pages).d.ptr[iVar1]);
  return;
}

Assistant:

void
PageViewPrivate::movePages()
{
	const int index = control->currentIndex();

	if( index != 0 )
	{
		const QPoint p = viewport->rect().topLeft() -
			QPoint( viewport->width(), 0 ) + QPoint( pagesOffset, 0 );

		pages.at( index - 1 )->move( p );
	}

	if( index < control->count() - 1 )
	{
		const QPoint p = viewport->rect().topLeft() +
			QPoint( viewport->width(), 0 ) + QPoint( pagesOffset, 0 );

		pages.at( index + 1 )->move( p );
	}

	const QPoint p = viewport->rect().topLeft() +
		QPoint( pagesOffset, 0 );

	pages.at( index )->move( p );
}